

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_D3D_opcode_dss(Context *ctx,char *opcode)

{
  long lVar1;
  size_t sVar2;
  size_t in_RDX;
  char *pcVar3;
  undefined8 auStack_110 [3];
  char local_f8 [8];
  char src0 [64];
  char src1 [64];
  char dst [64];
  
  auStack_110[2] = 0x11a9fc;
  make_D3D_destarg_string(ctx,src1 + 0x38,in_RDX);
  auStack_110[2] = 0x11aa1b;
  make_D3D_srcarg_string_in_buf(ctx,ctx->source_args,local_f8,0x40);
  auStack_110[2] = 0x11aa37;
  make_D3D_srcarg_string_in_buf(ctx,ctx->source_args + 1,src0 + 0x38,0x40);
  auStack_110[2] = 0x11aa3f;
  sVar2 = strlen(opcode);
  lVar1 = -(sVar2 + 0x10 & 0xfffffffffffffff0);
  *(undefined8 *)((long)auStack_110 + lVar1 + 0x10) = 0x11aa5b;
  lowercase(local_f8 + lVar1,opcode);
  pcVar3 = "+";
  if (ctx->coissue == 0) {
    pcVar3 = "";
  }
  *(char **)((long)auStack_110 + lVar1 + 8) = src0 + 0x38;
  *(undefined8 *)((long)auStack_110 + lVar1) = 0x11aa96;
  output_line(ctx,"%s%s%s, %s, %s",pcVar3,local_f8 + lVar1,src1 + 0x38,local_f8);
  return;
}

Assistant:

static void emit_D3D_opcode_dss(Context *ctx, const char *opcode)
{
    char dst[64]; make_D3D_destarg_string(ctx, dst, sizeof (dst));
    char src0[64]; make_D3D_srcarg_string(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_D3D_srcarg_string(ctx, 1, src1, sizeof (src1));
    opcode = lowercase((char *) alloca(strlen(opcode) + 1), opcode);
    output_line(ctx, "%s%s%s, %s, %s", ctx->coissue ? "+" : "",
                opcode, dst, src0, src1);
}